

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-test.c++
# Opt level: O0

void __thiscall kj::anon_unknown_0::TestCase707::TestCase707(TestCase707 *this)

{
  TestCase707 *this_local;
  
  TestCase::TestCase(&this->super_TestCase,
                     "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/filesystem-test.c++"
                     ,0x2c3,"InMemoryDirectory copy");
  (this->super_TestCase)._vptr_TestCase = (_func_int **)&PTR_run_00bff058;
  return;
}

Assistant:

TEST(Async, ArrayJoinVoid) {
  for (auto specificJoinPromisesOverload: {
    +[](kj::Array<kj::Promise<void>> promises) { return joinPromises(kj::mv(promises)); },
    +[](kj::Array<kj::Promise<void>> promises) { return joinPromisesFailFast(kj::mv(promises)); }
  }) {
    EventLoop loop;
    WaitScope waitScope(loop);

    auto builder = heapArrayBuilder<Promise<void>>(3);
    builder.add(READY_NOW);
    builder.add(READY_NOW);
    builder.add(READY_NOW);

    Promise<void> promise = specificJoinPromisesOverload(builder.finish());

    promise.wait(waitScope);
  }
}